

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void ravi_dump_stack(lua_State *L,char *s)

{
  ushort uVar1;
  StkId pTVar2;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  StkId pTVar6;
  GCObject *pGVar7;
  char *pcVar8;
  char *pcVar9;
  CallInfo *pCVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (s == (char *)0x0) {
    return;
  }
  pCVar10 = L->ci;
  puts("=======================");
  printf("Stack dump %s\n",s);
  puts("=======================");
  printf("L->top = %d\n",(ulong)((long)L->top - (long)L->stack) >> 4);
  do {
    if (pCVar10 == (CallInfo *)0x0) {
      putchar(10);
      return;
    }
    pTVar2 = pCVar10->func;
    uVar5 = (pTVar2->tt_ & 0x7f) - 6;
    uVar5 = uVar5 >> 4 | uVar5 * 0x10000000;
    if (uVar5 < 5) {
      uVar12 = (ulong)((long)pTVar2 - (long)L->stack) >> 4;
      switch(uVar5) {
      case 0:
        if (pTVar2->tt_ != 0x8006) {
          pcVar8 = "((((func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_00130f8b:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xa75,"void ravi_dump_ci(lua_State *, CallInfo *)");
        }
        if ((pTVar2->value_).f[8] != (_func_int_lua_State_ptr)0x6) {
          pcVar8 = "(((func)->value_).gc)->tt == ((6) | ((0) << 4))";
          goto LAB_00130f8b;
        }
        lVar3 = *(long *)((pTVar2->value_).f + 0x18);
        pTVar2 = (pCVar10->u).l.base;
        pTVar6 = pCVar10->top + -1;
        uVar13 = (ulong)((long)pCVar10->top - (long)L->stack) >> 4;
        uVar11 = (long)pTVar6 - (long)pTVar2;
        for (; uVar13 = (ulong)((int)uVar13 - 1), pTVar2 <= pTVar6; pTVar6 = pTVar6 + -1) {
          pcVar9 = "";
          pcVar8 = "";
          if (pTVar6 == pTVar2) {
            pcVar8 = "(base) ";
          }
          if (pTVar6 == L->top) {
            pcVar9 = "(L->top) ";
          }
          printf("stack[%d] reg[%d] = %s %s",uVar13,uVar11 >> 4,pcVar8,pcVar9);
          uVar1 = pTVar6->tt_;
          if (uVar1 == 0x16) {
            pcVar8 = "light C function";
LAB_00130dc7:
            puts(pcVar8);
          }
          else {
            if (uVar1 == 0x8026) {
              pcVar8 = "C closure";
              goto LAB_00130dc7;
            }
            if ((uVar1 & 0x7f) == 0x46) {
              pcVar8 = "fast C function";
              goto LAB_00130dc7;
            }
            if (uVar1 == 0x8006) {
              pcVar8 = "Lua closure";
              goto LAB_00130dc7;
            }
            uVar4 = uVar1 & 0xf;
            if (uVar4 == 6) {
              pcVar8 = "function";
              goto LAB_00130dc7;
            }
            if ((uVar1 | 0x10) != 0x8014) {
              if (uVar4 == 5) {
                pcVar8 = "table";
              }
              else {
                if (uVar4 == 4) goto LAB_00130de6;
                switch(uVar1) {
                case 0:
                  pcVar8 = "nil";
                  break;
                case 1:
                  pcVar8 = "boolean";
                  break;
                case 2:
                  pcVar8 = "light user data";
                  break;
                case 3:
                  printf("%.6f\n",(pTVar6->value_).gc);
                  goto LAB_00130dcc;
                default:
                  if (uVar1 == 0x13) {
                    pGVar7 = (pTVar6->value_).gc;
                    pcVar8 = "%lld\n";
                    goto LAB_00130e0c;
                  }
                  if (uVar1 == 0x8007) {
                    pcVar8 = "full user data";
                  }
                  else if (uVar1 == 0x8008) {
                    pcVar8 = "thread";
                  }
                  else {
                    pcVar8 = "other";
                  }
                }
              }
              goto LAB_00130dc7;
            }
LAB_00130de6:
            if (uVar4 != 4) {
              pcVar8 = "(((((((stack_ptr))->tt_)) & 0x0F)) == (4))";
LAB_00130f63:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xa8a,"void ravi_dump_ci(lua_State *, CallInfo *)");
            }
            if ((((pTVar6->value_).gc)->tt & 0xf) != 4) {
              pcVar8 = "(((((stack_ptr)->value_).gc)->tt) & 0x0F) == 4";
              goto LAB_00130f63;
            }
            pGVar7 = (GCObject *)&(pTVar6->value_).gc[1].tt;
            pcVar8 = "\'%s\'\n";
LAB_00130e0c:
            printf(pcVar8,pGVar7);
          }
LAB_00130dcc:
          uVar11 = uVar11 - 0x10;
        }
        printf("stack[%d] = Lua function (registers = %d, params = %d, locals = %d)\n",
               uVar12 & 0xffffffff,(ulong)*(byte *)(lVar3 + 0xc),(ulong)*(byte *)(lVar3 + 10),
               (ulong)*(uint *)(lVar3 + 0x24));
        goto LAB_00130f1c;
      case 1:
        pcVar8 = "stack[%d] = Light C function\n";
        break;
      case 2:
        pcVar8 = "stack[%d] = C closure\n";
        break;
      case 3:
        goto switchD_00130ce0_caseD_3;
      case 4:
        pcVar8 = "stack[%d] = Fast C function\n";
      }
      printf(pcVar8,uVar12 & 0xffffffff);
LAB_00130f1c:
      puts("---> called from ");
    }
switchD_00130ce0_caseD_3:
    pCVar10 = pCVar10->previous;
  } while( true );
}

Assistant:

void ravi_dump_stack(lua_State *L, const char *s) {
  if (!s)
    return;
  CallInfo *ci = L->ci;
  printf("=======================\n");
  printf("Stack dump %s\n", s);
  printf("=======================\n");
  printf("L->top = %d\n", (int)(L->top - L->stack));
  while (ci) {
    ravi_dump_ci(L, ci);
    ci = ci->previous;
  }
  printf("\n");
}